

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::SetTrimTypeFlags(ON_Brep *this,ON_BrepLoop *loop,bool bLazy)

{
  int iVar1;
  int *piVar2;
  ON_BrepTrim *pOVar3;
  TYPE TVar4;
  long lVar5;
  long lVar6;
  ON_BrepTrim *trim;
  bool local_3c;
  
  lVar5 = (long)(loop->m_ti).m_count;
  if (lVar5 < 1) {
    local_3c = true;
  }
  else {
    piVar2 = (loop->m_ti).m_a;
    pOVar3 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
    local_3c = true;
    lVar6 = 0;
    do {
      iVar1 = piVar2[lVar6];
      if ((!bLazy) || (pOVar3[iVar1].m_type == unknown)) {
        trim = pOVar3 + iVar1;
        TVar4 = TrimType(this,trim,false);
        trim->m_type = TVar4;
        if (TVar4 == unknown) {
          local_3c = false;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return local_3c;
}

Assistant:

ON_BrepEdge::ON_BrepEdge() 
  : ON_CurveProxy(0)
{
  memset(&m_edge_user,0,sizeof(m_edge_user));
  m_vi[0] = m_vi[1] = -1;
}